

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PNativeStruct * NewNativeStruct(FName *name,PTypeBase *outer)

{
  size_t parm1;
  int iVar1;
  PType *type;
  PClass *pPVar2;
  FName local_2c;
  PType *local_28;
  PType *stype;
  size_t bucket;
  PTypeBase *outer_local;
  FName *name_local;
  
  pPVar2 = PNativeStruct::RegistrationInfo.MyClass;
  bucket = (size_t)outer;
  outer_local = (PTypeBase *)name;
  iVar1 = FName::operator_cast_to_int(name);
  local_28 = FTypeTable::FindType(&TypeTable,pPVar2,(intptr_t)outer,(long)iVar1,(size_t *)&stype);
  if (local_28 == (PType *)0x0) {
    type = (PType *)DObject::operator_new((DObject *)0xc0,(size_t)pPVar2);
    FName::FName(&local_2c,name);
    PNativeStruct::PNativeStruct((PNativeStruct *)type,&local_2c);
    parm1 = bucket;
    pPVar2 = PNativeStruct::RegistrationInfo.MyClass;
    local_28 = type;
    iVar1 = FName::operator_cast_to_int(name);
    FTypeTable::AddType(&TypeTable,type,pPVar2,parm1,(long)iVar1,(size_t)stype);
  }
  return (PNativeStruct *)local_28;
}

Assistant:

PNativeStruct *NewNativeStruct(FName name, PTypeBase *outer)
{
	size_t bucket;
	PType *stype = TypeTable.FindType(RUNTIME_CLASS(PNativeStruct), (intptr_t)outer, (intptr_t)name, &bucket);
	if (stype == NULL)
	{
		stype = new PNativeStruct(name);
		TypeTable.AddType(stype, RUNTIME_CLASS(PNativeStruct), (intptr_t)outer, (intptr_t)name, bucket);
	}
	return static_cast<PNativeStruct *>(stype);
}